

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O3

bool __thiscall llvm::DWARFGdbIndex::parseImpl(DWARFGdbIndex *this,DataExtractor Data)

{
  SmallVectorBase *pSVar1;
  long lVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SmallVectorBase *pSVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *this_00;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  int local_6c;
  ulong local_68;
  AddressEntry local_60;
  SmallVectorBase *local_48;
  uint64_t local_40;
  uint64_t Offset;
  
  local_40 = 0;
  bVar13 = false;
  uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
  this->Version = uVar3;
  if (uVar3 == 7) {
    bVar13 = false;
    Offset = (uint64_t)this;
    uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 4) = uVar3;
    uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 8) = uVar3;
    uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 0xc) = uVar3;
    uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 0x10) = uVar3;
    uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 0x14) = uVar3;
    if (local_40 == *(uint *)(Offset + 4)) {
      uVar9 = *(int *)(Offset + 8) - *(uint *)(Offset + 4);
      uVar10 = uVar9 >> 4;
      pSVar1 = (SmallVectorBase *)(Offset + 0x18);
      if (*(uint *)(Offset + 0x24) < uVar10) {
        SmallVectorBase::grow_pod(pSVar1,(void *)(Offset + 0x28),(ulong)uVar10,0x10);
      }
      if (0xf < uVar9) {
        iVar11 = uVar10 + (uVar10 == 0);
        do {
          pSVar5 = (SmallVectorBase *)DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          local_60.HighAddress = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          local_60.LowAddress = (uint64_t)pSVar5;
          SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>::push_back
                    ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true> *)pSVar1,
                     (CompUnitEntry *)&local_60);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      uVar9 = *(int *)(Offset + 0xc) - *(int *)(Offset + 8);
      local_48 = (SmallVectorBase *)(Offset + 0x28);
      SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>::resize
                ((SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry> *)local_48,(ulong)uVar9 / 0x18
                );
      if (0x17 < uVar9) {
        local_68 = (ulong)(uVar9 / 0x18 + (uint)(uVar9 / 0x18 == 0));
        lVar12 = 0x10;
        uVar14 = 0;
        do {
          uVar6 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          uVar7 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          uVar8 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          if (*(uint *)(Offset + 0x30) <= uVar14) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x95,
                          "reference llvm::SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry>::operator[](size_type) [T = llvm::DWARFGdbIndex::TypeUnitEntry]"
                         );
          }
          lVar2 = *(long *)&((SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true> *)
                            &local_48->BeginX)->
                            super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>
          ;
          *(uint64_t *)(lVar2 + -0x10 + lVar12) = uVar6;
          *(uint64_t *)(lVar2 + -8 + lVar12) = uVar7;
          *(uint64_t *)(lVar2 + lVar12) = uVar8;
          uVar14 = uVar14 + 1;
          lVar12 = lVar12 + 0x18;
        } while (local_68 != uVar14);
      }
      uVar9 = *(int *)(Offset + 0x10) - *(int *)(Offset + 0xc);
      pSVar1 = (SmallVectorBase *)(Offset + 0x38);
      if (*(uint *)(Offset + 0x44) < uVar9 / 0x14) {
        SmallVectorBase::grow_pod(pSVar1,(void *)(Offset + 0x48),(ulong)(uVar9 / 0x14),0x18);
      }
      if (0x13 < uVar9) {
        iVar11 = uVar9 / 0x14 + (uint)(uVar9 / 0x14 == 0);
        do {
          local_48 = (SmallVectorBase *)DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          uVar6 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
          local_60.CuIndex = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
          local_60.LowAddress = (uint64_t)local_48;
          local_60.HighAddress = uVar6;
          SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>::push_back
                    ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true> *)pSVar1,
                     &local_60);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      uVar9 = *(int *)(Offset + 0x14) - *(int *)(Offset + 0x10);
      uVar10 = uVar9 >> 3;
      pSVar1 = (SmallVectorBase *)(Offset + 0x48);
      if (*(uint *)(Offset + 0x54) < uVar10) {
        SmallVectorBase::grow_pod(pSVar1,(void *)(Offset + 0x58),(ulong)uVar10,8);
      }
      if (7 < uVar9) {
        iVar11 = uVar10 + (uVar10 == 0);
        pSVar5 = (SmallVectorBase *)0x0;
        local_48 = pSVar1;
        do {
          uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
          uVar4 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
          local_60.LowAddress = CONCAT44(uVar4,uVar3);
          SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>::push_back
                    ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true> *)local_48,
                     (SymTableEntry *)&local_60);
          uVar9 = (int)pSVar5 + (uint)(uVar4 != 0 || uVar3 != 0);
          pSVar5 = (SmallVectorBase *)(ulong)uVar9;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        if (uVar9 != 0) {
          this_00 = (SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *)
                    (Offset + 0x58);
          uVar9 = 0;
          do {
            local_6c = 0;
            local_60.HighAddress = 0;
            local_60.LowAddress = (uint64_t)&local_60.CuIndex;
            SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
            emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
                      (this_00,&local_6c,(SmallVector<unsigned_int,_0U> *)&local_60);
            if ((uint32_t *)local_60.LowAddress != &local_60.CuIndex) {
              free((void *)local_60.LowAddress);
            }
            uVar14 = (ulong)*(uint *)(Offset + 0x60);
            local_68 = (ulong)uVar9;
            local_48 = pSVar5;
            if (uVar14 == 0) {
              __assert_fail("!empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                            ,0xa7,
                            "reference llvm::SmallVectorTemplateCommon<std::pair<unsigned int, llvm::SmallVector<unsigned int, 0>>>::back() [T = std::pair<unsigned int, llvm::SmallVector<unsigned int, 0>>]"
                           );
            }
            lVar12 = *(long *)(Offset + 0x58);
            *(int *)(lVar12 + -0x18 + uVar14 * 0x18) = (int)local_40 - *(int *)(Offset + 0x14);
            uVar3 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
            if (uVar3 != 0) {
              do {
                uVar4 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
                local_60.LowAddress = CONCAT44(local_60.LowAddress._4_4_,uVar4);
                SmallVectorTemplateBase<unsigned_int,_true>::push_back
                          ((SmallVectorTemplateBase<unsigned_int,_true> *)
                           (lVar12 + uVar14 * 0x18 + -0x10),(uint *)&local_60);
                uVar3 = uVar3 - 1;
              } while (uVar3 != 0);
            }
            uVar9 = (int)local_68 + 1;
            pSVar5 = local_48;
          } while (uVar9 != (uint)local_48);
        }
      }
      if (Data.Data.Length < local_40) {
        __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                      ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
      }
      *(char **)(Offset + 0x68) = Data.Data.Data + local_40;
      *(size_t *)(Offset + 0x70) = Data.Data.Length - local_40;
      *(int *)(Offset + 0x78) = (int)local_40;
      bVar13 = true;
    }
  }
  return bVar13;
}

Assistant:

bool DWARFGdbIndex::parseImpl(DataExtractor Data) {
  uint64_t Offset = 0;

  // Only version 7 is supported at this moment.
  Version = Data.getU32(&Offset);
  if (Version != 7)
    return false;

  CuListOffset = Data.getU32(&Offset);
  TuListOffset = Data.getU32(&Offset);
  AddressAreaOffset = Data.getU32(&Offset);
  SymbolTableOffset = Data.getU32(&Offset);
  ConstantPoolOffset = Data.getU32(&Offset);

  if (Offset != CuListOffset)
    return false;

  uint32_t CuListSize = (TuListOffset - CuListOffset) / 16;
  CuList.reserve(CuListSize);
  for (uint32_t i = 0; i < CuListSize; ++i) {
    uint64_t CuOffset = Data.getU64(&Offset);
    uint64_t CuLength = Data.getU64(&Offset);
    CuList.push_back({CuOffset, CuLength});
  }

  // CU Types are no longer needed as DWARF skeleton type units never made it
  // into the standard.
  uint32_t TuListSize = (AddressAreaOffset - TuListOffset) / 24;
  TuList.resize(TuListSize);
  for (uint32_t I = 0; I < TuListSize; ++I) {
    uint64_t CuOffset = Data.getU64(&Offset);
    uint64_t TypeOffset = Data.getU64(&Offset);
    uint64_t Signature = Data.getU64(&Offset);
    TuList[I] = {CuOffset, TypeOffset, Signature};
  }

  uint32_t AddressAreaSize = (SymbolTableOffset - AddressAreaOffset) / 20;
  AddressArea.reserve(AddressAreaSize);
  for (uint32_t i = 0; i < AddressAreaSize; ++i) {
    uint64_t LowAddress = Data.getU64(&Offset);
    uint64_t HighAddress = Data.getU64(&Offset);
    uint32_t CuIndex = Data.getU32(&Offset);
    AddressArea.push_back({LowAddress, HighAddress, CuIndex});
  }

  // The symbol table. This is an open addressed hash table. The size of the
  // hash table is always a power of 2.
  // Each slot in the hash table consists of a pair of offset_type values. The
  // first value is the offset of the symbol's name in the constant pool. The
  // second value is the offset of the CU vector in the constant pool.
  // If both values are 0, then this slot in the hash table is empty. This is ok
  // because while 0 is a valid constant pool index, it cannot be a valid index
  // for both a string and a CU vector.
  uint32_t SymTableSize = (ConstantPoolOffset - SymbolTableOffset) / 8;
  SymbolTable.reserve(SymTableSize);
  uint32_t CuVectorsTotal = 0;
  for (uint32_t i = 0; i < SymTableSize; ++i) {
    uint32_t NameOffset = Data.getU32(&Offset);
    uint32_t CuVecOffset = Data.getU32(&Offset);
    SymbolTable.push_back({NameOffset, CuVecOffset});
    if (NameOffset || CuVecOffset)
      ++CuVectorsTotal;
  }

  // The constant pool. CU vectors are stored first, followed by strings.
  // The first value is the number of CU indices in the vector. Each subsequent
  // value is the index and symbol attributes of a CU in the CU list.
  for (uint32_t i = 0; i < CuVectorsTotal; ++i) {
    ConstantPoolVectors.emplace_back(0, SmallVector<uint32_t, 0>());
    auto &Vec = ConstantPoolVectors.back();
    Vec.first = Offset - ConstantPoolOffset;

    uint32_t Num = Data.getU32(&Offset);
    for (uint32_t j = 0; j < Num; ++j)
      Vec.second.push_back(Data.getU32(&Offset));
  }

  ConstantPoolStrings = Data.getData().drop_front(Offset);
  StringPoolOffset = Offset;
  return true;
}